

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QCss::ImportRule>::emplace<QCss::ImportRule_const&>
          (QMovableArrayOps<QCss::ImportRule> *this,qsizetype i,ImportRule *args)

{
  ImportRule **ppIVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_80;
  ImportRule local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QCss::ImportRule>).
           super_QArrayDataPointer<QCss::ImportRule>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QCss::ImportRule>).super_QArrayDataPointer<QCss::ImportRule>.
        size == i) {
      qVar4 = QArrayDataPointer<QCss::ImportRule>::freeSpaceAtEnd
                        ((QArrayDataPointer<QCss::ImportRule> *)this);
      if (qVar4 == 0) goto LAB_0054c515;
      QCss::ImportRule::ImportRule
                ((this->super_QGenericArrayOps<QCss::ImportRule>).
                 super_QArrayDataPointer<QCss::ImportRule>.ptr +
                 (this->super_QGenericArrayOps<QCss::ImportRule>).
                 super_QArrayDataPointer<QCss::ImportRule>.size,args);
LAB_0054c604:
      pqVar2 = &(this->super_QGenericArrayOps<QCss::ImportRule>).
                super_QArrayDataPointer<QCss::ImportRule>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0054c5c3;
    }
LAB_0054c515:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QCss::ImportRule>::freeSpaceAtBegin
                        ((QArrayDataPointer<QCss::ImportRule> *)this);
      if (qVar4 != 0) {
        QCss::ImportRule::ImportRule
                  ((this->super_QGenericArrayOps<QCss::ImportRule>).
                   super_QArrayDataPointer<QCss::ImportRule>.ptr + -1,args);
        ppIVar1 = &(this->super_QGenericArrayOps<QCss::ImportRule>).
                   super_QArrayDataPointer<QCss::ImportRule>.ptr;
        *ppIVar1 = *ppIVar1 + -1;
        goto LAB_0054c604;
      }
    }
  }
  local_58.media.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.media.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.href.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.media.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.href.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.href.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QCss::ImportRule::ImportRule(&local_58,args);
  bVar5 = (this->super_QGenericArrayOps<QCss::ImportRule>).super_QArrayDataPointer<QCss::ImportRule>
          .size != 0;
  QArrayDataPointer<QCss::ImportRule>::detachAndGrow
            ((QArrayDataPointer<QCss::ImportRule> *)this,(uint)(i == 0 && bVar5),1,
             (ImportRule **)0x0,(QArrayDataPointer<QCss::ImportRule> *)0x0);
  if (i == 0 && bVar5) {
    QCss::ImportRule::ImportRule
              ((this->super_QGenericArrayOps<QCss::ImportRule>).
               super_QArrayDataPointer<QCss::ImportRule>.ptr + -1,&local_58);
    ppIVar1 = &(this->super_QGenericArrayOps<QCss::ImportRule>).
               super_QArrayDataPointer<QCss::ImportRule>.ptr;
    *ppIVar1 = *ppIVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QCss::ImportRule>).
              super_QArrayDataPointer<QCss::ImportRule>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QCss::ImportRule> *)this,i,1);
    QCss::ImportRule::ImportRule(local_80.displaceFrom,&local_58);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QCss::ImportRule::~ImportRule(&local_58);
LAB_0054c5c3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }